

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

void Gia_Iso2ManCollectOrder2_rec(Gia_Man_t *p,int Id,Vec_Int_t *vVec)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar1 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrentId(p,Id);
  pObj = Gia_ManObj(p,Id);
  uVar3 = *(ulong *)pObj;
  uVar2 = (uint)uVar3;
  uVar5 = uVar3 & 0x1fffffff;
  if (uVar5 == 0x1fffffff || (int)uVar2 < 0) {
    if (-1 < (int)uVar2 || (int)uVar5 == 0x1fffffff) {
      iVar1 = Gia_ObjIsPi(p,pObj);
      if ((iVar1 == 0) && ((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0)) {
        __assert_fail("Gia_ObjIsConst0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso2.c"
                      ,0x198,"void Gia_Iso2ManCollectOrder2_rec(Gia_Man_t *, int, Vec_Int_t *)");
      }
      goto LAB_00588e23;
    }
  }
  else {
    uVar4 = (uint)(uVar3 >> 0x20);
    if (pObj[-(ulong)(uVar4 & 0x1fffffff)].Value < pObj[-uVar5].Value) {
      Gia_Iso2ManCollectOrder2_rec(p,Id - (uVar4 & 0x1fffffff),vVec);
      uVar3 = *(ulong *)pObj;
    }
    else {
      Gia_Iso2ManCollectOrder2_rec(p,Id - (uVar2 & 0x1fffffff),vVec);
      uVar3 = (ulong)*(uint *)&pObj->field_0x4;
    }
  }
  Gia_Iso2ManCollectOrder2_rec(p,Id - ((uint)uVar3 & 0x1fffffff),vVec);
LAB_00588e23:
  Vec_IntPush(vVec,Id);
  return;
}

Assistant:

void Gia_Iso2ManCollectOrder2_rec( Gia_Man_t * p, int Id, Vec_Int_t * vVec )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ObjFanin0(pObj)->Value <= Gia_ObjFanin1(pObj)->Value )
        {
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId0(pObj, Id), vVec );
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId1(pObj, Id), vVec );
        }
        else
        {
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId1(pObj, Id), vVec );
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId0(pObj, Id), vVec );
        }
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId0(pObj, Id), vVec );
    }
    else if ( Gia_ObjIsPi(p, pObj) )
    {
    }
    else assert( Gia_ObjIsConst0(pObj) );
    Vec_IntPush( vVec, Id );
}